

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int mem_live_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  uint uVar1;
  uint uVar2;
  out_edge_t peVar3;
  
  peVar3 = (bb->out_edges).head;
  if (peVar3 == (out_edge_t)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      uVar1 = bitmap_ior(bb->out,bb->out,peVar3->dst->in);
      uVar2 = uVar2 | uVar1;
      peVar3 = (peVar3->out_link).next;
    } while (peVar3 != (out_edge_t)0x0);
  }
  return uVar2;
}

Assistant:

static int mem_live_con_func_n (gen_ctx_t gen_ctx MIR_UNUSED, bb_t bb) {
  edge_t e;
  int change_p = FALSE;

  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e))
    change_p |= bitmap_ior (bb->mem_live_out, bb->mem_live_out, e->dst->mem_live_in);
  return change_p;
}